

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::InsertFunctionInfoCheck
          (Lowerer *this,RegOpnd *funcOpnd,Instr *insertBeforeInstr,AddrOpnd *inlinedFuncInfo,
          BailOutKind bailOutKind,BailOutInfo *bailOutInfo)

{
  BailOutInstrTemplate<IR::Instr> *this_00;
  IndirOpnd *newSrc;
  
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (BailOnNotEqual,bailOutKind,bailOutInfo,bailOutInfo->bailOutFunc);
  newSrc = IR::IndirOpnd::New(funcOpnd,0x28,TyUint64,insertBeforeInstr->m_func,false);
  IR::Instr::SetSrc1(&this_00->super_Instr,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(&this_00->super_Instr,&inlinedFuncInfo->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::InsertFunctionInfoCheck(IR::RegOpnd * funcOpnd, IR::Instr *insertBeforeInstr, IR::AddrOpnd* inlinedFuncInfo, IR::BailOutKind bailOutKind, BailOutInfo *bailOutInfo)
{
    IR::Instr *bailOutIfWrongFuncInfo = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, bailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);

    // if (VarTo<JavascriptFunction>(r1)->functionInfo != funcInfo) goto noInlineLabel
    // BrNeq_A noInlineLabel, r1->functionInfo, funcInfo
    IR::IndirOpnd* opndFuncInfo = IR::IndirOpnd::New(funcOpnd, Js::JavascriptFunction::GetOffsetOfFunctionInfo(), TyMachPtr, insertBeforeInstr->m_func);
    bailOutIfWrongFuncInfo->SetSrc1(opndFuncInfo);
    bailOutIfWrongFuncInfo->SetSrc2(inlinedFuncInfo);

    insertBeforeInstr->InsertBefore(bailOutIfWrongFuncInfo);

    return bailOutIfWrongFuncInfo;
}